

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_functype_t * wasm_func_type(wasm_func_t *func)

{
  Object *pOVar1;
  wasm_functype_t *this;
  FuncType local_58;
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_func_type");
  this = (wasm_functype_t *)operator_new(0x30);
  pOVar1 = (func->super_wasm_extern_t).super_wasm_ref_t.I.obj_;
  if (pOVar1->kind_ - DefinedFunc < 2) {
    local_58.super_ExternType.kind = pOVar1[1].kind_;
    local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001ea8b0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_58.params,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pOVar1[1].finalizer_);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_58.results,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pOVar1[1].finalizer_._M_invoker);
    wasm_functype_t::wasm_functype_t(this,&local_58);
    local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001ea8b0;
    if (local_58.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return this;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Func, Base = wabt::interp::Object]"
               );
}

Assistant:

own wasm_functype_t* wasm_func_type(const wasm_func_t* func) {
  TRACE0();
  return new wasm_functype_t{func->As<Func>()->type()};
}